

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O3

int AF_A_Punch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AWeapon *this;
  PClass *pPVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  PClass *pPVar9;
  void *pvVar10;
  AInventory *pAVar11;
  AActor *this_00;
  VMValue *pVVar12;
  char *__assertion;
  bool bVar13;
  bool bVar14;
  FTranslatedLineTarget t;
  FSoundID local_74;
  FName local_70;
  FName local_6c;
  undefined1 local_68 [32];
  FTranslatedLineTarget local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bb8a4;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005bb894;
  this_00 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_005bb61c;
    pPVar9 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar9 == (PClass *)0x0) {
      iVar5 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar9 = (PClass *)CONCAT44(extraout_var,iVar5);
      (this_00->super_DThinker).super_DObject.Class = pPVar9;
    }
    bVar13 = pPVar9 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar13;
    bVar14 = pPVar9 == pPVar3;
    if (!bVar14 && !bVar13) {
      do {
        pPVar9 = pPVar9->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar9 != (PClass *)0x0);
        if (pPVar9 == pPVar3) break;
      } while (pPVar9 != (PClass *)0x0);
    }
    pVVar12 = (VMValue *)(ulong)(bVar14 || bVar13);
    uVar6 = (uint)bVar13;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005bb8a4;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_005bb894;
LAB_005bb61c:
    this_00 = (AActor *)0x0;
    pVVar12 = param;
    uVar6 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005bb894:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005bb8a4;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar9 = (PClass *)puVar2[1];
          if (pPVar9 == (PClass *)0x0) {
            pPVar9 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar12,uVar6,ret);
            puVar2[1] = pPVar9;
          }
          bVar13 = pPVar9 != (PClass *)0x0;
          if (pPVar9 != pPVar3 && bVar13) {
            do {
              pPVar9 = pPVar9->ParentClass;
              bVar13 = pPVar9 != (PClass *)0x0;
              if (pPVar9 == pPVar3) break;
            } while (pPVar9 != (PClass *)0x0);
          }
          if (!bVar13) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005bb8a4;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005bb894;
    }
    if ((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar10 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_005bb6e0;
        if (pvVar10 == (void *)0x0) goto LAB_005bb6de;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005bb8a4:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_005bb6de:
  pvVar10 = (void *)0x0;
LAB_005bb6e0:
  if ((((this_00->player != (player_t *)0x0) &&
       (this = this_00->player->ReadyWeapon, this != (AWeapon *)0x0)) &&
      (pvVar10 != (void *)0x0 && ((this->super_AInventory).field_0x4de & 1) == 0)) &&
     ((*(int *)((long)pvVar10 + 8) == 1 &&
      (bVar13 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1), !bVar13)))) {
    return 0;
  }
  uVar6 = FRandom::GenRand32(&pr_punch);
  bVar4 = ((char)uVar6 + ((byte)((uVar6 & 0xff) / 5) & 0xfe) * -5) * '\x02' + 2;
  pAVar11 = AActor::FindInventory
                      (this_00,(PClassActor *)APowerStrength::RegistrationInfo.MyClass,false);
  uVar6 = ((uint)bVar4 + (uint)bVar4) * 5;
  if (pAVar11 == (AInventory *)0x0) {
    uVar6 = (uint)bVar4;
  }
  uVar7 = FRandom::GenRand32(&pr_punch);
  uVar8 = FRandom::GenRand32(&pr_punch);
  pPVar3 = (PClass *)
           ((double)(int)((uVar7 & 0xff) - (uVar8 & 0xff)) * 0.02197265625 +
           (this_00->Angles).Yaw.Degrees);
  local_68._16_8_ = (DObject *)0x0;
  local_68._24_8_ = pPVar3;
  P_AimLineAttack((AActor *)local_68,(DAngle *)this_00,64.0,
                  (FTranslatedLineTarget *)(local_68 + 0x18),(DAngle *)0x0,(int)local_68 + 0x10,
                  (AActor *)0x0,(AActor *)0x0);
  local_6c.Index = 0x84;
  local_70.Index = 0x40;
  local_68._8_8_ = pPVar3;
  P_LineAttack(this_00,(DAngle *)(local_68 + 8),64.0,(DAngle *)local_68,uVar6,&local_6c,&local_70,1,
               &local_48,(int *)0x0);
  if (local_48.linetarget != (AActor *)0x0) {
    local_74.ID = S_FindSound("*fist");
    S_Sound(this_00,1,&local_74,1.0,1.0);
    (this_00->Angles).Yaw.Degrees = local_48.angleFromSource.Degrees;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Punch)
{
	PARAM_ACTION_PROLOGUE;

	DAngle 	angle;
	int 		damage;
	DAngle 		pitch;
	FTranslatedLineTarget t;

	if (self->player != NULL)
	{
		AWeapon *weapon = self->player->ReadyWeapon;
		if (weapon != NULL && !(weapon->WeaponFlags & WIF_DEHAMMO) && ACTION_CALL_FROM_PSPRITE())
		{
			if (!weapon->DepleteAmmo (weapon->bAltFire))
				return 0;
		}
	}

	damage = (pr_punch()%10+1)<<1;

	if (self->FindInventory<APowerStrength>())	
		damage *= 10;

	angle = self->Angles.Yaw + pr_punch.Random2() * (5.625 / 256);
	pitch = P_AimLineAttack (self, angle, MELEERANGE);

	P_LineAttack (self, angle, MELEERANGE, pitch, damage, NAME_Melee, NAME_BulletPuff, LAF_ISMELEEATTACK, &t);

	// turn to face target
	if (t.linetarget)
	{
		S_Sound (self, CHAN_WEAPON, "*fist", 1, ATTN_NORM);
		self->Angles.Yaw = t.angleFromSource;
	}
	return 0;
}